

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O0

Vector3d *
ear::cart(Vector3d *__return_storage_ptr__,double azimuth,double elevation,double distance)

{
  double dVar1;
  double dVar2;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double distance_local;
  double elevation_local;
  double azimuth_local;
  
  local_28 = distance;
  distance_local = elevation;
  elevation_local = azimuth;
  azimuth_local = (double)__return_storage_ptr__;
  dVar1 = radians<double,_0>(-azimuth);
  dVar1 = sin(dVar1);
  dVar2 = radians<double,_0>(distance_local);
  dVar2 = cos(dVar2);
  local_30 = dVar1 * dVar2 * local_28;
  dVar1 = radians<double,_0>(-elevation_local);
  dVar1 = cos(dVar1);
  dVar2 = radians<double,_0>(distance_local);
  dVar2 = cos(dVar2);
  local_38 = dVar1 * dVar2 * local_28;
  dVar1 = radians<double,_0>(distance_local);
  local_40 = sin(dVar1);
  local_40 = local_40 * local_28;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(__return_storage_ptr__,&local_30,&local_38,&local_40)
  ;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d cart(double azimuth, double elevation, double distance) {
    return Eigen::Vector3d(
        sin(radians(-azimuth)) * cos(radians(elevation)) * distance,
        cos(radians(-azimuth)) * cos(radians(elevation)) * distance,
        sin(radians(elevation)) * distance);
  }